

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O0

void P_RunEffect(AActor *actor,int effects)

{
  uint uVar1;
  int iVar2;
  particle_t *ppVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  TAngle<double> local_f8;
  undefined1 local_f0 [8];
  DVector3 pos_3;
  DAngle ang;
  int color;
  TAngle<double> local_c0;
  undefined1 local_b8 [8];
  DVector3 pos_2;
  DVector3 pos_1;
  double pathdist_1;
  particle_t *particle_1;
  DVector3 pos;
  double pathdist;
  double speed;
  DAngle an;
  double backz;
  double backy;
  double backx;
  int i;
  particle_t *particle;
  DAngle moveangle;
  int effects_local;
  AActor *actor_local;
  
  moveangle.Degrees._4_4_ = effects;
  TVector3<double>::Angle((TVector3<double> *)&particle);
  if (((moveangle.Degrees._4_4_ & 1) != 0) &&
     (uVar1 = FIntCVar::operator_cast_to_int(&cl_rockettrails), (uVar1 & 1) != 0)) {
    dVar6 = actor->radius;
    dVar4 = TAngle<double>::Cos((TAngle<double> *)&particle);
    dVar4 = -dVar6 * 2.0 * dVar4;
    dVar6 = actor->radius;
    dVar5 = TAngle<double>::Sin((TAngle<double> *)&particle);
    dVar5 = -dVar6 * 2.0 * dVar5;
    an.Degrees = actor->Height * (0.6666666666666666 - (actor->Vel).Z / 8.0);
    TAngle<double>::operator+((TAngle<double> *)&speed,90.0);
    uVar1 = FRandom::operator()(&M_Random);
    ppVar3 = JitterParticle((uVar1 & 0x1f) + 3);
    if (ppVar3 != (particle_t *)0x0) {
      iVar2 = FRandom::operator()(&M_Random);
      pos.Z = (double)iVar2 / 256.0;
      AActor::Vec3Offset((DVector3 *)&particle_1,actor,dVar4 - (actor->Vel).X * pos.Z,
                         dVar5 - (actor->Vel).Y * pos.Z,an.Degrees - (actor->Vel).Z * pos.Z,false);
      TVector3<double>::operator=(&ppVar3->Pos,(TVector3<double> *)&particle_1);
      iVar2 = FRandom::operator()(&M_Random);
      dVar6 = (double)(iVar2 + -0x80) * 0.005;
      dVar7 = TAngle<double>::Cos((TAngle<double> *)&speed);
      (ppVar3->Vel).X = dVar6 * dVar7 + (ppVar3->Vel).X;
      dVar7 = TAngle<double>::Sin((TAngle<double> *)&speed);
      (ppVar3->Vel).Y = dVar6 * dVar7 + (ppVar3->Vel).Y;
      (ppVar3->Vel).Z = (ppVar3->Vel).Z - 0.027777777777777776;
      (ppVar3->Acc).Z = (ppVar3->Acc).Z - 0.05;
      ppVar3->color = yellow;
      ppVar3->size = 2.0;
    }
    for (backx._4_4_ = 6; backx._4_4_ != 0; backx._4_4_ = backx._4_4_ + -1) {
      uVar1 = FRandom::operator()(&M_Random);
      ppVar3 = JitterParticle((uVar1 & 0x1f) + 3);
      if (ppVar3 == (particle_t *)0x0) break;
      iVar2 = FRandom::operator()(&M_Random);
      dVar8 = (double)iVar2 / 256.0;
      dVar6 = (actor->Vel).X;
      dVar7 = (actor->Vel).Y;
      dVar9 = an.Degrees - (actor->Vel).Z * dVar8;
      iVar2 = FRandom::operator()(&M_Random);
      AActor::Vec3Offset((DVector3 *)&pos_2.Z,actor,dVar4 - dVar6 * dVar8,dVar5 - dVar7 * dVar8,
                         dVar9 + (double)iVar2 / 64.0,false);
      TVector3<double>::operator=(&ppVar3->Pos,(TVector3<double> *)&pos_2.Z);
      iVar2 = FRandom::operator()(&M_Random);
      dVar6 = (double)(iVar2 + -0x80) * 0.005;
      dVar7 = TAngle<double>::Cos((TAngle<double> *)&speed);
      (ppVar3->Vel).X = dVar6 * dVar7 + (ppVar3->Vel).X;
      dVar7 = TAngle<double>::Sin((TAngle<double> *)&speed);
      (ppVar3->Vel).Y = dVar6 * dVar7 + (ppVar3->Vel).Y;
      (ppVar3->Vel).Z = (ppVar3->Vel).Z + 0.0125;
      (ppVar3->Acc).Z = (ppVar3->Acc).Z + 0.025;
      uVar1 = FRandom::operator()(&M_Random);
      if ((uVar1 & 7) == 0) {
        ppVar3->color = grey1;
      }
      else {
        ppVar3->color = grey2;
      }
      ppVar3->size = 3.0;
    }
  }
  if (((moveangle.Degrees._4_4_ & 2) != 0) &&
     (uVar1 = FIntCVar::operator_cast_to_int(&cl_rockettrails), (uVar1 & 1) != 0)) {
    dVar6 = actor->radius;
    TAngle<double>::TAngle(&local_c0,(TAngle<double> *)&particle);
    AActor::Vec3Angle((DVector3 *)local_b8,actor,-dVar6 * 2.0,&local_c0,
                      (-actor->Height * (actor->Vel).Z) / 8.0 + actor->Height * 0.6666666666666666,
                      false);
    TAngle<double>::operator+((TAngle<double> *)&stack0xffffffffffffff38,180.0);
    P_DrawSplash2(6,(DVector3 *)local_b8,(DAngle *)&stack0xffffffffffffff38,2,2);
  }
  if ((moveangle.Degrees._4_4_ & 0x70000) != 0) {
    iVar2 = (int)(moveangle.Degrees._4_4_ & 0x70000) >> 0xf;
    MakeFountain(actor,*P_RunEffect::fountainColors[iVar2],*P_RunEffect::fountainColors[iVar2 + 1]);
  }
  if ((moveangle.Degrees._4_4_ & 0x20) != 0) {
    for (backx._4_4_ = 3; 0 < backx._4_4_; backx._4_4_ = backx._4_4_ + -1) {
      ppVar3 = JitterParticle(0x10);
      if (ppVar3 != (particle_t *)0x0) {
        iVar2 = FRandom::operator()(&M_Random);
        TAngle<double>::TAngle((TAngle<double> *)&pos_3.Z,(double)iVar2 * 1.40625);
        dVar6 = actor->radius;
        TAngle<double>::TAngle(&local_f8,(TAngle<double> *)&pos_3.Z);
        AActor::Vec3Angle((DVector3 *)local_f0,actor,dVar6,&local_f8,0.0,false);
        TVector3<double>::operator=(&ppVar3->Pos,(TVector3<double> *)local_f0);
        uVar1 = FRandom::operator()(&M_Random);
        ppVar3->color = *P_RunEffect::protectColors[(int)(uVar1 & 1)];
        (ppVar3->Vel).Z = 1.0;
        iVar2 = FRandom::operator()(&M_Random);
        (ppVar3->Acc).Z = (double)iVar2 / 512.0;
        ppVar3->size = 1.0;
        iVar2 = FRandom::operator()(&M_Random);
        if (iVar2 < 0x80) {
          (ppVar3->Pos).Z = actor->Height + (ppVar3->Pos).Z;
          (ppVar3->Vel).Z = -(ppVar3->Vel).Z;
          (ppVar3->Acc).Z = -(ppVar3->Acc).Z;
        }
      }
    }
  }
  return;
}

Assistant:

void P_RunEffect (AActor *actor, int effects)
{
	DAngle moveangle = actor->Vel.Angle();

	particle_t *particle;
	int i;

	if ((effects & FX_ROCKET) && (cl_rockettrails & 1))
	{
		// Rocket trail
		double backx = -actor->radius * 2 * moveangle.Cos();
		double backy = -actor->radius * 2 * moveangle.Sin();
		double backz = actor->Height * ((2. / 3) - actor->Vel.Z / 8);

		DAngle an = moveangle + 90.;
		double speed;

		particle = JitterParticle (3 + (M_Random() & 31));
		if (particle) {
			double pathdist = M_Random() / 256.;
			DVector3 pos = actor->Vec3Offset(
				backx - actor->Vel.X * pathdist,
				backy - actor->Vel.Y * pathdist,
				backz - actor->Vel.Z * pathdist);
			particle->Pos = pos;
			speed = (M_Random () - 128) * (1./200);
			particle->Vel.X += speed * an.Cos();
			particle->Vel.Y += speed * an.Sin();
			particle->Vel.Z -= 1./36;
			particle->Acc.Z -= 1./20;
			particle->color = yellow;
			particle->size = 2;
		}
		for (i = 6; i; i--) {
			particle_t *particle = JitterParticle (3 + (M_Random() & 31));
			if (particle) {
				double pathdist = M_Random() / 256.;
				DVector3 pos = actor->Vec3Offset(
					backx - actor->Vel.X * pathdist,
					backy - actor->Vel.Y * pathdist,
					backz - actor->Vel.Z * pathdist + (M_Random() / 64.));
				particle->Pos = pos;

				speed = (M_Random () - 128) * (1./200);
				particle->Vel.X += speed * an.Cos();
				particle->Vel.Y += speed * an.Sin();
				particle->Vel.Z += 1. / 80;
				particle->Acc.Z += 1. / 40;
				if (M_Random () & 7)
					particle->color = grey2;
				else
					particle->color = grey1;
				particle->size = 3;
			} else
				break;
		}
	}
	if ((effects & FX_GRENADE) && (cl_rockettrails & 1))
	{
		// Grenade trail

		DVector3 pos = actor->Vec3Angle(-actor->radius * 2, moveangle, -actor->Height * actor->Vel.Z / 8 + actor->Height * (2. / 3));

		P_DrawSplash2 (6, pos, moveangle + 180, 2, 2);
	}
	if (effects & FX_FOUNTAINMASK)
	{
		// Particle fountain

		static const int *fountainColors[16] = 
			{ &black,	&black,
			  &red,		&red1,
			  &green,	&green1,
			  &blue,	&blue1,
			  &yellow,	&yellow1,
			  &purple,	&purple1,
			  &black,	&grey3,
			  &grey4,	&white
			};
		int color = (effects & FX_FOUNTAINMASK) >> 15;
		MakeFountain (actor, *fountainColors[color], *fountainColors[color+1]);
	}
	if (effects & FX_RESPAWNINVUL)
	{
		// Respawn protection

		static const int *protectColors[2] = { &yellow1, &white };

		for (i = 3; i > 0; i--)
		{
			particle = JitterParticle (16);
			if (particle != NULL)
			{
				DAngle ang = M_Random() * (360 / 256.);
				DVector3 pos = actor->Vec3Angle(actor->radius, ang, 0);
				particle->Pos = pos;
				particle->color = *protectColors[M_Random() & 1];
				particle->Vel.Z = 1;
				particle->Acc.Z = M_Random () / 512.;
				particle->size = 1;
				if (M_Random () < 128)
				{ // make particle fall from top of actor
					particle->Pos.Z += actor->Height;
					particle->Vel.Z = -particle->Vel.Z;
					particle->Acc.Z = -particle->Acc.Z;
				}
			}
		}
	}
}